

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

void __thiscall deqp::gls::RandomShaderCase::deinit(RandomShaderCase *this)

{
  TextureCube *this_00;
  RandomShaderCase *this_local;
  
  if (this->m_tex2D != (Texture2D *)0x0) {
    (*this->m_tex2D->_vptr_Texture2D[1])();
  }
  this_00 = this->m_texCube;
  if (this_00 != (TextureCube *)0x0) {
    glu::TextureCube::~TextureCube(this_00);
    operator_delete(this_00,0x180);
  }
  this->m_tex2D = (Texture2D *)0x0;
  this->m_texCube = (TextureCube *)0x0;
  std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::clear
            (&this->m_vertexArrays);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_indices);
  return;
}

Assistant:

void RandomShaderCase::deinit (void)
{
	delete m_tex2D;
	delete m_texCube;

	m_tex2D		= DE_NULL;
	m_texCube	= DE_NULL;

	// Free up memory
	m_vertexArrays.clear();
	m_indices.clear();
}